

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MetainfoSet.cpp
# Opt level: O1

vector<JSONNode,_std::allocator<JSONNode>_> * __thiscall
ser::MetainfoSet::GenerateNodes
          (vector<JSONNode,_std::allocator<JSONNode>_> *__return_storage_ptr__,MetainfoSet *this)

{
  _Rb_tree_node_base *operand;
  size_t *psVar1;
  char cVar2;
  pointer pcVar3;
  int iVar4;
  undefined *puVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  bool *pbVar7;
  int *piVar8;
  float *pfVar9;
  double *pdVar10;
  _Base_ptr p_Var11;
  ostream *poVar12;
  undefined4 extraout_var;
  size_t sVar13;
  SerializationException *this_00;
  char *pcVar14;
  _Rb_tree_header *p_Var15;
  SerializationException exception;
  ostringstream ss;
  json_string local_220;
  vector<JSONNode,_std::allocator<JSONNode>_> *local_200;
  JSONNode local_1f8;
  undefined1 *local_1f0;
  undefined1 local_1e0 [16];
  undefined **local_1d0;
  _Alloc_hider local_1c8;
  size_type local_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  json_string local_1a8 [11];
  
  (__return_storage_ptr__->super__Vector_base<JSONNode,_std::allocator<JSONNode>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<JSONNode,_std::allocator<JSONNode>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<JSONNode,_std::allocator<JSONNode>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_200 = __return_storage_ptr__;
  std::vector<JSONNode,_std::allocator<JSONNode>_>::reserve
            (__return_storage_ptr__,(this->data_)._M_t._M_impl.super__Rb_tree_header._M_node_count);
  p_Var11 = (this->data_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var15 = &(this->data_)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var11 != p_Var15) {
    do {
      local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_220,*(long *)(p_Var11 + 1),
                 (long)&(p_Var11[1]._M_parent)->_M_color + *(long *)(p_Var11 + 1));
      puVar5 = &void::typeinfo;
      if (*(long **)(p_Var11 + 2) != (long *)0x0) {
        puVar5 = (undefined *)(**(code **)(**(long **)(p_Var11 + 2) + 0x10))();
      }
      operand = p_Var11 + 2;
      pcVar14 = *(char **)(puVar5 + 8);
      if ((pcVar14 == _ofstream) ||
         ((cVar2 = *pcVar14, cVar2 != '*' && (iVar4 = strcmp(pcVar14,_ofstream), iVar4 == 0)))) {
        pbVar7 = boost::any_cast<bool_const&>((any *)operand);
        JSONNode::JSONNode(&local_1f8,&local_220,*pbVar7);
      }
      else if ((pcVar14 == _put) || ((cVar2 != '*' && (iVar4 = strcmp(pcVar14,_put), iVar4 == 0))))
      {
        piVar8 = boost::any_cast<int_const&>((any *)operand);
        JSONNode::JSONNode(&local_1f8,&local_220,*piVar8);
      }
      else if ((pcVar14 == ___throw_out_of_range_fmt) ||
              ((cVar2 != '*' && (iVar4 = strcmp(pcVar14,___throw_out_of_range_fmt), iVar4 == 0)))) {
        pfVar9 = boost::any_cast<float_const&>((any *)operand);
        JSONNode::JSONNode(&local_1f8,&local_220,*pfVar9);
      }
      else if ((pcVar14 == __M_extract<float>) ||
              ((cVar2 != '*' && (iVar4 = strcmp(pcVar14,__M_extract<float>), iVar4 == 0)))) {
        pdVar10 = boost::any_cast<double_const&>((any *)operand);
        JSONNode::JSONNode(&local_1f8,&local_220,*pdVar10);
      }
      else {
        if ((pcVar14 != "NSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEE") &&
           ((cVar2 == '*' ||
            (iVar4 = strcmp(pcVar14,"NSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEE"),
            iVar4 != 0)))) {
          local_1c8._M_p = (pointer)&local_1b8;
          local_1d0 = &PTR__SerializationException_0013c730;
          local_1c0 = 0;
          local_1b8._M_local_buf[0] = '\0';
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"Error: generation of node ",0x1a);
          poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,local_220._M_dataplus._M_p,
                               local_220._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar12," in anyNode (MetainfoSet.cpp file) is not possible",0x32);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12," because the type ",0x12);
          if (*(placeholder **)operand == (placeholder *)0x0) {
            puVar5 = &void::typeinfo;
          }
          else {
            iVar4 = (*(*(placeholder **)operand)->_vptr_placeholder[2])();
            puVar5 = (undefined *)CONCAT44(extraout_var,iVar4);
          }
          pcVar14 = *(char **)(puVar5 + 8) + (**(char **)(puVar5 + 8) == '*');
          sVar13 = strlen(pcVar14);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12,pcVar14,sVar13);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12," is not supported\n",0x12);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar12,"This is a bug and should be notified\n",0x25);
          std::__cxx11::stringbuf::str();
          std::__cxx11::string::_M_assign((string *)&local_1c8);
          if (local_1f0 != local_1e0) {
            operator_delete(local_1f0);
          }
          this_00 = (SerializationException *)__cxa_allocate_exception(0x28);
          SerializationException::SerializationException
                    (this_00,(SerializationException *)&local_1d0);
          __cxa_throw(this_00,&SerializationException::typeinfo,
                      SerializationException::~SerializationException);
        }
        pbVar6 = boost::any_cast<std::__cxx11::string_const&>((any *)operand);
        local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
        pcVar3 = (pbVar6->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_1a8,pcVar3,pcVar3 + pbVar6->_M_string_length);
        JSONNode::JSONNode(&local_1f8,&local_220,local_1a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
          operator_delete(local_1a8[0]._M_dataplus._M_p);
        }
      }
      std::vector<JSONNode,_std::allocator<JSONNode>_>::emplace_back<JSONNode>(local_200,&local_1f8)
      ;
      if (local_1f8.internal != (internalJSONNode *)0x0) {
        psVar1 = &(local_1f8.internal)->refcount;
        *psVar1 = *psVar1 - 1;
        if (*psVar1 == 0) {
          internalJSONNode::deleteInternal(local_1f8.internal);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_220._M_dataplus._M_p != &local_220.field_2) {
        operator_delete(local_220._M_dataplus._M_p);
      }
      p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11);
    } while ((_Rb_tree_header *)p_Var11 != p_Var15);
  }
  return local_200;
}

Assistant:

std::vector< JSONNode> MetainfoSet::GenerateNodes() const
{
    std::vector< JSONNode> res;
    res.reserve(data_.size());
    for (std::map<std::string, boost::any>::const_iterator iter = data_.begin(); iter != data_.end(); ++iter)
    {
        res.push_back(anyNode(iter->first, iter->second));
    }
    return res;
}